

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::MatchRepeatedFieldIndices
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,MapKeyComparator *key_comparator,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields,vector<int,_std::allocator<int>_> *match_list1,
          vector<int,_std::allocator<int>_> *match_list2)

{
  pointer piVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  int index1;
  size_type __n;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  Metadata MVar15;
  bool local_161;
  FieldDescriptor *repeated_field_local;
  uint local_154;
  int unpacked_any_local;
  allocator_type local_149;
  MessageDifferencer *local_148;
  MapKeyComparator *key_comparator_local;
  Reporter *local_138;
  Message *local_130;
  Message *local_128;
  size_type local_120;
  uint local_114;
  vector<bool,_std::allocator<bool>_> visited;
  vector<int,_std::allocator<int>_> num_diffs_list1;
  NumDiffsReporter num_diffs_reporter;
  MaximumMatcher local_b0;
  _func_void *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  
  repeated_field_local = repeated_field;
  unpacked_any_local = unpacked_any;
  key_comparator_local = key_comparator;
  MVar15 = Message::GetMetadata(message1);
  local_130 = message1;
  uVar4 = Reflection::FieldSize(MVar15.reflection,message1,repeated_field_local);
  MVar15 = Message::GetMetadata(message2);
  local_128 = message2;
  iVar5 = Reflection::FieldSize(MVar15.reflection,message2,repeated_field_local);
  bVar2 = IsTreatedAsSmartSet(this,repeated_field_local);
  __n = (size_type)(int)uVar4;
  local_b0.count1_ = -1;
  local_154 = uVar4;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(match_list1,__n,&local_b0.count1_);
  local_b0.count1_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(match_list2,(long)iVar5,&local_b0.count1_);
  local_148 = (MessageDifferencer *)CONCAT44(local_148._4_4_,iVar5);
  local_120 = __n;
  if ((iVar5 == 1 && uVar4 == 1) &&
     (key_comparator_local == (MapKeyComparator *)0x0 && this->reporter_ == (Reporter *)0x0)) {
    piVar1 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish != piVar1) {
      *piVar1 = 0;
      piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar1) {
        *piVar1 = 0;
        return true;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  local_138 = this->reporter_;
  this->reporter_ = (Reporter *)0x0;
  num_diffs_reporter.super_Reporter._vptr_Reporter = (_func_int **)&PTR__Reporter_004d3be8;
  num_diffs_reporter.num_diffs_ = 0;
  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (bVar2) {
    local_b0.count1_ = 0x7fffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&num_diffs_list1,__n,&local_b0.count1_);
  }
  if (this->scope_ == PARTIAL) {
    local_58 = (_func_void *)0x0;
    uStack_50 = 0;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_b0.match_callback_.super__Function_base._M_functor._M_unused._M_object =
         operator_new(0x38);
    *(MessageDifferencer **)local_b0.match_callback_.super__Function_base._M_functor._M_unused._0_8_
         = this;
    *(FieldDescriptor ***)
     ((long)local_b0.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 8) =
         &repeated_field_local;
    *(MapKeyComparator ***)
     ((long)local_b0.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &key_comparator_local;
    *(Message **)
     ((long)local_b0.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
         local_130;
    *(Message **)
     ((long)local_b0.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x20) =
         local_128;
    *(int **)((long)local_b0.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x28)
         = &unpacked_any_local;
    *(vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      **)((long)local_b0.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x30) =
         parent_fields;
    local_b0._0_8_ = CONCAT44((uint)local_148,(int)local_120);
    local_b0.match_callback_._M_invoker =
         std::
         _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc:1958:21)>
         ::_M_invoke;
    local_b0.match_callback_.super__Function_base._M_functor._8_8_ = uStack_50;
    local_b0.match_callback_.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc:1958:21)>
         ::_M_manager;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_b0.cached_match_results_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    local_b0.cached_match_results_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    local_b0.match_list1_ = match_list1;
    local_b0.match_list2_ = match_list2;
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,0xffffffff);
    local_58 = (_func_void *)
               local_b0.match_callback_.super__Function_base._M_functor._M_unused._0_8_;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (match_list1,local_120,(value_type_conflict3 *)&visited);
    visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (local_b0.match_list2_,(long)iVar5,(value_type_conflict3 *)&visited);
    local_148 = this;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    uVar4 = 0;
    bVar2 = 0 < local_b0.count1_;
    if (0 < local_b0.count1_) {
      bVar2 = true;
      iVar5 = 0;
      uVar4 = 0;
      do {
        local_161 = false;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&visited,(long)local_b0.count1_,&local_161,&local_149);
        bVar3 = anon_unknown_5::MaximumMatcher::FindArgumentPathDFS(&local_b0,iVar5,&visited);
        bVar13 = local_138 == (Reporter *)0x0;
        if (visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)visited.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        uVar4 = uVar4 + bVar3;
        if (bVar13 && !bVar3) break;
        iVar5 = iVar5 + 1;
        bVar2 = iVar5 < local_b0.count1_;
      } while (iVar5 < local_b0.count1_);
    }
    this = local_148;
    uVar6 = 0;
    if ((!bVar2) && (uVar6 = uVar4, 0 < local_b0.count2_)) {
      piVar1 = ((local_b0.match_list2_)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      do {
        lVar11 = (long)piVar1[lVar7];
        if (lVar11 != -1) {
          ((local_b0.match_list1_)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar11] = (int)lVar7;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_b0.count2_);
    }
    bVar2 = local_138 == (Reporter *)0x0;
    bVar13 = uVar6 == local_154;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                     *)&local_b0.cached_match_results_);
    if (local_b0.match_callback_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_b0.match_callback_.super__Function_base._M_manager)
                ((_Any_data *)&local_b0.match_callback_,(_Any_data *)&local_b0.match_callback_,
                 __destroy_functor);
    }
    if (!bVar2 || bVar13) {
      bVar13 = bVar13 || bVar2;
LAB_00322196:
      bVar2 = IsTreatedAsSmartList(this,repeated_field_local);
      if (bVar2) {
        local_b0._0_8_ = match_list1;
        visited.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
        .super__Bit_iterator_base._M_p = (_Bit_type *)match_list2;
        if ((this->match_indices_for_smart_list_callback_).super__Function_base._M_manager ==
            (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->match_indices_for_smart_list_callback_)._M_invoker)
                  ((_Any_data *)&this->match_indices_for_smart_list_callback_,
                   (vector<int,_std::allocator<int>_> **)&local_b0,
                   (vector<int,_std::allocator<int>_> **)&visited);
      }
      this->reporter_ = local_138;
      goto LAB_003221f9;
    }
  }
  else {
    bVar3 = IsTreatedAsSet(this,repeated_field_local);
    if (bVar3 || bVar2) {
LAB_00321e3d:
      uVar4 = local_154;
      if ((int)(uint)local_148 < (int)local_154) {
        uVar4 = (uint)local_148;
      }
      uVar8 = (ulong)uVar4;
      if (0 < (int)uVar4) {
        uVar10 = 0;
        do {
          iVar5 = (int)uVar10;
          bVar3 = IsMatch(this,repeated_field_local,key_comparator_local,local_130,local_128,
                          unpacked_any_local,parent_fields,(Reporter *)0x0,iVar5,iVar5);
          if (!bVar3) {
            uVar8 = uVar10 & 0xffffffff;
            break;
          }
          piVar1 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar10) {
LAB_0032223e:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
          }
          piVar1[uVar10] = iVar5;
          piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar10)
          goto LAB_0032223e;
          piVar1[uVar10] = iVar5;
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
    }
    else {
      bVar3 = IsTreatedAsSmartList(this,repeated_field_local);
      uVar8 = 0;
      if (bVar3) goto LAB_00321e3d;
    }
    uVar4 = (uint)uVar8;
    bVar3 = (int)uVar4 < (int)local_154;
    bVar13 = true;
    if ((int)uVar4 < (int)local_154) {
      uVar10 = (long)(int)uVar4;
      bVar9 = true;
      local_114 = uVar4;
      do {
        iVar5 = -1;
        index1 = (int)uVar10;
        if ((int)uVar8 < (int)(uint)local_148) {
          uVar12 = 0xffffffff;
          uVar8 = (long)(int)uVar4;
          do {
            piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar8) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar8);
            }
            lVar7 = (long)piVar1[uVar8];
            if ((lVar7 == -1) ||
               (((bVar2 && (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar10] != 0)) &&
                (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7] != 0)))) {
              iVar5 = (int)uVar8;
              if (bVar2) {
                num_diffs_reporter.num_diffs_ = 0;
                bVar13 = IsMatch(this,repeated_field_local,key_comparator_local,local_130,local_128,
                                 unpacked_any_local,parent_fields,&num_diffs_reporter.super_Reporter
                                 ,index1,iVar5);
                if (bVar13) {
                  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] = 0;
                  goto LAB_0032206d;
                }
                if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)repeated_field_local->type_ * 4) != 10) ||
                   (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10] <= num_diffs_reporter.num_diffs_))
                goto LAB_0032206d;
                piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <=
                    uVar8) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar8);
                }
                lVar7 = (long)piVar1[uVar8];
                if ((lVar7 != -1) &&
                   (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar7] <= num_diffs_reporter.num_diffs_))
                goto LAB_0032206d;
                num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] = num_diffs_reporter.num_diffs_;
              }
              else {
                bVar13 = IsMatch(this,repeated_field_local,key_comparator_local,local_130,local_128,
                                 unpacked_any_local,parent_fields,(Reporter *)0x0,index1,iVar5);
LAB_0032206d:
                if (bVar13 == false) goto LAB_0032208b;
              }
              if ((!bVar2) ||
                 (uVar12 = uVar8 & 0xffffffff,
                 num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10] == 0)) break;
            }
LAB_0032208b:
            uVar8 = uVar8 + 1;
            iVar5 = (int)uVar12;
          } while ((uint)local_148 != (int)uVar8);
        }
        bVar14 = iVar5 != -1;
        if (bVar14) {
          bVar14 = true;
          if (bVar2) {
            uVar8 = (ulong)iVar5;
            piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar8)
            goto LAB_00322252;
            uVar8 = (ulong)piVar1[uVar8];
            if (uVar8 != 0xffffffffffffffff) {
              piVar1 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                .super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar8)
              goto LAB_00322252;
              piVar1[uVar8] = -1;
              bVar14 = false;
            }
          }
          piVar1 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = uVar10;
          if ((ulong)((long)(match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar10) {
LAB_00322252:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8);
          }
          uVar8 = (ulong)iVar5;
          piVar1[uVar10] = iVar5;
          piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar8)
          goto LAB_00322252;
          piVar1[uVar8] = index1;
        }
        bVar13 = bVar9;
        if (local_138 == (Reporter *)0x0 && bVar14 == false) break;
        uVar10 = uVar10 + 1;
        bVar3 = (long)uVar10 < (long)local_120;
        uVar8 = (ulong)local_114;
        bVar13 = (bool)(bVar14 & bVar9);
        bVar9 = (bool)(bVar14 & bVar9);
      } while (local_154 != (uint)uVar10);
    }
    if (!bVar3) goto LAB_00322196;
  }
  bVar13 = false;
LAB_003221f9:
  if (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar13;
}

Assistant:

bool MessageDifferencer::MatchRepeatedFieldIndices(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    const MapKeyComparator* key_comparator,
    const std::vector<SpecificField>& parent_fields,
    std::vector<int>* match_list1, std::vector<int>* match_list2) {
  const int count1 =
      message1.GetReflection()->FieldSize(message1, repeated_field);
  const int count2 =
      message2.GetReflection()->FieldSize(message2, repeated_field);
  const bool is_treated_as_smart_set = IsTreatedAsSmartSet(repeated_field);

  match_list1->assign(count1, -1);
  match_list2->assign(count2, -1);

  // In the special case where both repeated fields have exactly one element,
  // return without calling the comparator.  This optimization prevents the
  // pathological case of deeply nested repeated fields of size 1 from taking
  // exponential-time to compare.
  //
  // In the case where reporter_ is set, we need to do the compare here to
  // properly distinguish a modify from an add+delete.  The code below will not
  // pass the reporter along in recursive calls to nested repeated fields, so
  // the inner call will have the opportunity to perform this optimization and
  // avoid exponential-time behavior.
  //
  // In the case where key_comparator is set, we need to do the compare here to
  // fulfill the interface contract that keys will be compared even if the user
  // asked to ignore that field.  The code will only compare the key fields
  // which (hopefully) do not contain further repeated fields.
  if (count1 == 1 && count2 == 1 && reporter_ == nullptr &&
      key_comparator == nullptr) {
    match_list1->at(0) = 0;
    match_list2->at(0) = 0;
    return true;
  }

  // Ensure that we don't report differences during the matching process. Since
  // field comparators could potentially use this message differencer object to
  // perform further comparisons, turn off reporting here and re-enable it
  // before returning.
  Reporter* reporter = reporter_;
  reporter_ = NULL;
  NumDiffsReporter num_diffs_reporter;
  std::vector<int32_t> num_diffs_list1;
  if (is_treated_as_smart_set) {
    num_diffs_list1.assign(count1, std::numeric_limits<int32_t>::max());
  }

  bool success = true;
  // Find potential match if this is a special repeated field.
  if (scope_ == PARTIAL) {
    // When partial matching is enabled, Compare(a, b) && Compare(a, c)
    // doesn't necessarily imply Compare(b, c). Therefore a naive greedy
    // algorithm will fail to find a maximum matching.
    // Here we use the augmenting path algorithm.
    auto callback = [&](int i1, int i2) {
      return IsMatch(repeated_field, key_comparator, &message1, &message2,
                     unpacked_any, parent_fields, nullptr, i1, i2);
    };
    MaximumMatcher matcher(count1, count2, std::move(callback), match_list1,
                           match_list2);
    // If diff info is not needed, we should end the matching process as
    // soon as possible if not all items can be matched.
    bool early_return = (reporter == nullptr);
    int match_count = matcher.FindMaximumMatch(early_return);
    if (match_count != count1 && early_return) return false;
    success = success && (match_count == count1);
  } else {
    int start_offset = 0;
    // If the two repeated fields are treated as sets, optimize for the case
    // where both start with same items stored in the same order.
    if (IsTreatedAsSet(repeated_field) || is_treated_as_smart_set ||
        IsTreatedAsSmartList(repeated_field)) {
      start_offset = std::min(count1, count2);
      for (int i = 0; i < count1 && i < count2; i++) {
        if (IsMatch(repeated_field, key_comparator, &message1, &message2,
                    unpacked_any, parent_fields, nullptr, i, i)) {
          match_list1->at(i) = i;
          match_list2->at(i) = i;
        } else {
          start_offset = i;
          break;
        }
      }
    }
    for (int i = start_offset; i < count1; ++i) {
      // Indicates any matched elements for this repeated field.
      bool match = false;
      int matched_j = -1;

      for (int j = start_offset; j < count2; j++) {
        if (match_list2->at(j) != -1) {
          if (!is_treated_as_smart_set || num_diffs_list1[i] == 0 ||
              num_diffs_list1[match_list2->at(j)] == 0) {
            continue;
          }
        }

        if (is_treated_as_smart_set) {
          num_diffs_reporter.Reset();
          match =
              IsMatch(repeated_field, key_comparator, &message1, &message2,
                      unpacked_any, parent_fields, &num_diffs_reporter, i, j);
        } else {
          match = IsMatch(repeated_field, key_comparator, &message1, &message2,
                          unpacked_any, parent_fields, nullptr, i, j);
        }

        if (is_treated_as_smart_set) {
          if (match) {
            num_diffs_list1[i] = 0;
          } else if (repeated_field->cpp_type() ==
                     FieldDescriptor::CPPTYPE_MESSAGE) {
            // Replace with the one with fewer diffs.
            const int32_t num_diffs = num_diffs_reporter.GetNumDiffs();
            if (num_diffs < num_diffs_list1[i]) {
              // If j has been already matched to some element, ensure the
              // current num_diffs is smaller.
              if (match_list2->at(j) == -1 ||
                  num_diffs < num_diffs_list1[match_list2->at(j)]) {
                num_diffs_list1[i] = num_diffs;
                match = true;
              }
            }
          }
        }

        if (match) {
          matched_j = j;
          if (!is_treated_as_smart_set || num_diffs_list1[i] == 0) {
            break;
          }
        }
      }

      match = (matched_j != -1);
      if (match) {
        if (is_treated_as_smart_set && match_list2->at(matched_j) != -1) {
          // This is to revert the previously matched index in list2.
          match_list1->at(match_list2->at(matched_j)) = -1;
          match = false;
        }
        match_list1->at(i) = matched_j;
        match_list2->at(matched_j) = i;
      }
      if (!match && reporter == nullptr) return false;
      success = success && match;
    }
  }

  if (IsTreatedAsSmartList(repeated_field)) {
    match_indices_for_smart_list_callback_(match_list1, match_list2);
  }

  reporter_ = reporter;

  return success;
}